

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaig.h
# Opt level: O2

void Mini_AigPush(Mini_Aig_t *p,int Lit0,int Lit1)

{
  int iVar1;
  int *piVar2;
  int nCapMin;
  
  iVar1 = p->nCap;
  if (iVar1 < p->nSize + 2) {
    nCapMin = iVar1 * 2;
    if (iVar1 < 0xff) {
      nCapMin = 0xff;
    }
    Mini_AigGrow(p,nCapMin);
  }
  piVar2 = p->pArray;
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  piVar2[iVar1] = Lit0;
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  piVar2[iVar1] = Lit1;
  return;
}

Assistant:

static void Mini_AigPush( Mini_Aig_t * p, int Lit0, int Lit1 )
{
    if ( p->nSize + 2 > p->nCap )
    {
        if ( p->nCap < MINI_AIG_START_SIZE )
            Mini_AigGrow( p, MINI_AIG_START_SIZE );
        else
            Mini_AigGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Lit0;
    p->pArray[p->nSize++] = Lit1;
}